

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void predict_or_learn<false,false,true,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  float *pfVar5;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  v_array<float> scores_array;
  uint32_t prediction;
  stringstream outputStringStream;
  label_t mc_label_data;
  undefined4 in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  uint uVar6;
  undefined4 in_stack_fffffffffffffe0c;
  polyprediction *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  example *ec_00;
  learner<char,_example> *this;
  uint local_1ac;
  stringstream local_1a8 [392];
  ulong local_20;
  long local_18;
  ulong *local_8;
  
  local_20 = *(ulong *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((uint)local_20 == 0) || ((*in_RDI < (local_20 & 0xffffffff) && ((uint)local_20 != -1)))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"label ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)local_20);
    poVar4 = std::operator<<(poVar4," is not in {1,");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_8);
    poVar4 = std::operator<<(poVar4,"} This won\'t work right.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = 1;
  ec_00 = *(example **)(local_18 + 0x6850);
  this = *(learner<char,_example> **)(local_18 + 0x6858);
  uVar2 = *(undefined8 *)(local_18 + 0x6860);
  uVar3 = *(undefined8 *)(local_18 + 0x6868);
  *(undefined4 *)(local_18 + 0x6830) = 0;
  *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
  LEARNER::learner<char,_example>::multipredict
            (this,ec_00,0,CONCAT44(0x7f7fffff,in_stack_fffffffffffffe18),in_stack_fffffffffffffe10,
             SUB41((uint)in_stack_fffffffffffffe0c >> 0x18,0));
  for (uVar6 = 2; (ulong)uVar6 <= *local_8; uVar6 = uVar6 + 1) {
    fVar1 = *(float *)(local_8[2] + (ulong)(uVar6 - 1) * 0x20);
    pfVar5 = (float *)(local_8[2] + (ulong)(local_1ac - 1) * 0x20);
    if (*pfVar5 <= fVar1 && fVar1 != *pfVar5) {
      local_1ac = uVar6;
    }
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    for (in_stack_fffffffffffffe04 = 1; (ulong)in_stack_fffffffffffffe04 <= *local_8;
        in_stack_fffffffffffffe04 = in_stack_fffffffffffffe04 + 1) {
      add_passthrough_feature_magic
                ((example *)&in_stack_fffffffffffffe10->scalars,
                 CONCAT44(in_stack_fffffffffffffe0c,uVar6),
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc);
    }
  }
  v_array<float>::clear
            ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  for (uVar6 = 0; (ulong)uVar6 < *local_8; uVar6 = uVar6 + 1) {
    v_array<float>::push_back
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,uVar6),
               (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  *(example **)(local_18 + 0x6850) = ec_00;
  *(learner<char,_example> **)(local_18 + 0x6858) = this;
  *(undefined8 *)(local_18 + 0x6860) = uVar2;
  *(undefined8 *)(local_18 + 0x6868) = uVar3;
  *(ulong *)(local_18 + 0x6828) = local_20;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}